

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

void __thiscall HttpRequest::parseMethod(HttpRequest *this,char *method)

{
  int iVar1;
  MethodType local_1c;
  uint32_t i;
  char *method_local;
  HttpRequest *this_local;
  
  local_1c = kMethodOptions;
  while( true ) {
    if (kMethodConnect < local_1c) {
      this->mMethod = kMethodUnknown;
      return;
    }
    iVar1 = strcmp(method,gMethodTypeList[local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + kMethodGet;
  }
  this->mMethod = local_1c;
  return;
}

Assistant:

void HttpRequest::parseMethod( const char *method )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	for ( uint32_t i = 0; i < JH_ARRAY_SIZE( gMethodTypeList ); i++ )
	{
		//LOG_NOISE( "matching %s", gMethodTypeList[ i ] );
		if ( strcmp( method, gMethodTypeList[ i ] ) == 0 )
		{
			mMethod = (MethodType)i;
			LOG( "Found method %s", gMethodTypeList[ mMethod ] );
			return;
		}
	}
	
	LOG( "Failed to match method \"%s\"", method );
	mMethod = kMethodUnknown;
}